

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

bool __thiscall RenX::Server::unmute(Server *this,PlayerInfo *player)

{
  ssize_t sVar1;
  size_t in_RCX;
  int in_R8D;
  string local_48;
  __sv_type local_28;
  PlayerInfo *local_18;
  PlayerInfo *player_local;
  Server *this_local;
  
  local_18 = player;
  player_local = (PlayerInfo *)this;
  string_printf_abi_cxx11_(&local_48,"textunmute pid%u",(ulong)(uint)player->id);
  local_28 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_48);
  sVar1 = send(this,(int)local_28._M_len,local_28._M_str,in_RCX,in_R8D);
  std::__cxx11::string::~string((string *)&local_48);
  return 0 < (int)sVar1;
}

Assistant:

bool RenX::Server::unmute(const RenX::PlayerInfo &player) {
	return send(string_printf("textunmute pid%u", player.id)) > 0;
}